

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingPointers.cpp
# Opt level: O1

int main(void)

{
  pthread_mutex_t *ppVar1;
  __atomic_base<unsigned_long> _Var2;
  atomic<unsigned_long> aVar3;
  _Head_base<0UL,_int_*,_false> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  int iVar5;
  size_t sVar6;
  Session *pSVar7;
  undefined8 uVar8;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_02;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_03;
  long lVar9;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_04;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_05;
  basic_ostream<char,_std::char_traits<char>_> *out;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_06;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_07;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_08;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_09;
  SessionWriter *this_00;
  _Head_base<0UL,_int_*,_false> *in_R8;
  _Head_base<0UL,_int_*,_false> *p_Var10;
  _Head_base<0UL,_int_*,_false> *p_Var11;
  _Head_base<0UL,_int_*,_false> *p_Var12;
  _Head_base<0UL,_int_*,_false> *p_Var13;
  _Head_base<0UL,_int_*,_false> *p_Var14;
  _Head_base<0UL,_int_*,_false> *p_Var15;
  long *in_FS_OFFSET;
  cx_string<12UL> cVar16;
  timespec ts;
  unique_ptr<int,_std::default_delete<int>_> uptr;
  int *ptr;
  shared_ptr<int> sptr;
  void *const_void_pointer;
  void *void_pointer;
  int value;
  undefined1 local_398 [64];
  _Head_base<0UL,_int_*,_false> local_358;
  int *local_350;
  shared_ptr<int> local_348;
  address local_338;
  _Head_base<0UL,_int_*,_false> local_330;
  SessionWriter *local_328;
  int local_31c;
  undefined1 local_318 [16];
  _Alloc_hider local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  uint64_t local_2a8;
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  undefined1 local_260 [16];
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  uint64_t local_1f0;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  uint64_t local_138;
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [16];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  uint64_t local_80;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  char local_38 [8];
  
  p_Var10 = (_Head_base<0UL,_int_*,_false> *)local_398;
  p_Var11 = (_Head_base<0UL,_int_*,_false> *)local_398;
  p_Var12 = (_Head_base<0UL,_int_*,_false> *)local_398;
  p_Var14 = (_Head_base<0UL,_int_*,_false> *)local_398;
  p_Var13 = (_Head_base<0UL,_int_*,_false> *)local_398;
  p_Var15 = (_Head_base<0UL,_int_*,_false> *)local_398;
  local_350 = (int *)0x0;
  local_358._M_head_impl = (int *)operator_new(4);
  *local_358._M_head_impl = 1;
  local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
       1;
  (local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count =
       1;
  (local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109d68;
  local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 2;
  out = extraout_RDX;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar7 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
    in_R8 = p_Var10;
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      in_R8 = p_Var10;
    }
    __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    out = extraout_RDX_06;
  }
  this_00 = (SessionWriter *)(*in_FS_OFFSET + -0x38);
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i != 0) {
LAB_001026cb:
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar7 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_398._0_8_ = (int *)0x0;
      local_398._8_8_ = 0;
      clock_gettime(0,(timespec *)local_398);
      in_R8 = &local_358;
      binlog::SessionWriter::
      addEvent<int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
                (this_00,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_398._0_8_ * 1000000000 + local_398._8_8_,&local_350,
                 (unique_ptr<int,_std::default_delete<int>_> *)in_R8,&local_348);
      out = extraout_RDX_00;
      goto LAB_00102713;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar7 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
    local_f0._0_8_ = 0;
    local_f0._8_2_ = info;
    local_e0._M_p = (pointer)&local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"main","");
    local_328 = this_00;
    local_c0._M_p = (pointer)&local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"main","");
    local_a0._M_p = (pointer)&local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
               ,"");
    local_80 = 0xe;
    local_78._M_p = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Pointers: {} {} {}","");
    cVar16 = binlog::detail::
             concatenated_tags<char_const(&)[19],int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
                       ((char (*) [19])"Pointers: {} {} {}",&local_350,
                        (unique_ptr<int,_std::default_delete<int>_> *)&local_358,&local_348);
    local_398._0_8_ = cVar16._data._0_8_;
    local_398._8_5_ = cVar16._data._8_5_;
    local_58._M_p = (pointer)&local_48;
    sVar6 = strlen(local_398);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,local_398,local_398 + sVar6)
    ;
    iVar5 = pthread_mutex_lock(ppVar1);
    if (iVar5 == 0) {
      local_f0._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_f0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
      }
      this_00 = local_328;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      goto LAB_001026cb;
    }
    iVar5 = std::__throw_system_error(iVar5);
LAB_00103552:
    iVar5 = std::__throw_system_error(iVar5);
LAB_00103559:
    iVar5 = std::__throw_system_error(iVar5);
LAB_00103560:
    uVar8 = std::__throw_system_error(iVar5);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
    }
    if (local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_358._M_head_impl != (int *)0x0) {
      operator_delete(local_358._M_head_impl,4);
    }
    _Unwind_Resume(uVar8);
  }
LAB_00102713:
  _Var4._M_head_impl = local_358._M_head_impl;
  local_350 = &local_31c;
  local_31c = 3;
  local_358._M_head_impl = (int *)0x0;
  if (_Var4._M_head_impl != (int *)0x0) {
    operator_delete(_Var4._M_head_impl,4);
    out = extraout_RDX_01;
  }
  this._M_pi = local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    out = extraout_RDX_02;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar7 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
    in_R8 = p_Var11;
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      in_R8 = p_Var11;
    }
    __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    out = extraout_RDX_07;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar7 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_1a8._0_8_ = 0;
      local_1a8._8_2_ = info;
      local_198._M_p = (pointer)&local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"main","");
      local_178._M_p = (pointer)&local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"main","");
      local_158._M_p = (pointer)&local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,"");
      local_138 = 0x16;
      local_130._M_p = (pointer)&local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Pointers: {} {} {}","");
      cVar16 = binlog::detail::
               concatenated_tags<char_const(&)[19],int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
                         ((char (*) [19])"Pointers: {} {} {}",&local_350,
                          (unique_ptr<int,_std::default_delete<int>_> *)&local_358,&local_348);
      local_398._0_8_ = cVar16._data._0_8_;
      local_398._8_5_ = cVar16._data._8_5_;
      local_110._M_p = (pointer)&local_100;
      sVar6 = strlen(local_398);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,local_398,local_398 + sVar6);
      iVar5 = pthread_mutex_lock(ppVar1);
      if (iVar5 != 0) goto LAB_00103552;
      local_1a8._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_1a8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_p != &local_148) {
        operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_p != &local_168) {
        operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_p != &local_188) {
        operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar7 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    local_398._0_8_ = (int *)0x0;
    local_398._8_8_ = 0;
    clock_gettime(0,(timespec *)local_398);
    in_R8 = &local_358;
    binlog::SessionWriter::
    addEvent<int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
              (this_00,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_398._0_8_ * 1000000000 + local_398._8_8_,&local_350,
               (unique_ptr<int,_std::default_delete<int>_> *)in_R8,&local_348);
    out = extraout_RDX_03;
  }
  local_330._M_head_impl = (int *)0xf777123;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar7 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
    in_R8 = p_Var12;
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      in_R8 = p_Var12;
    }
    __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    out = extraout_RDX_08;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar7 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
        in_R8 = p_Var14;
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
          in_R8 = p_Var14;
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_260._0_8_ = 0;
      local_260._8_2_ = info;
      local_250._M_p = (pointer)&local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"main","");
      local_230._M_p = (pointer)&local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"main","");
      local_210._M_p = (pointer)&local_200;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,"");
      local_1f0 = 0x29;
      local_1e8._M_p = (pointer)&local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"Raw pointer value: {} {}","");
      local_338.value = 0xf777123;
      binlog::detail::concatenated_tags<char_const(&)[25],binlog::address,void*&>
                ((cx_string<50UL> *)local_398,(detail *)"Raw pointer value: {} {}",
                 (char (*) [25])&local_338,(address *)&local_330,&in_R8->_M_head_impl);
      local_1c8._M_p = (pointer)&local_1b8;
      sVar6 = strlen(local_398);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,local_398,local_398 + sVar6);
      iVar5 = pthread_mutex_lock(ppVar1);
      if (iVar5 != 0) goto LAB_00103559;
      local_260._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_260,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != &local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_p != &local_1d8) {
        operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_p != &local_200) {
        operator_delete(local_210._M_p,local_200._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_p != &local_220) {
        operator_delete(local_230._M_p,local_220._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_p != &local_240) {
        operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar7 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    local_398._0_8_ = (int *)0x0;
    local_398._8_8_ = 0;
    clock_gettime(0,(timespec *)local_398);
    lVar9 = local_398._0_8_ * 1000000000;
    local_398._0_8_ = (int *)0xf777123;
    in_R8 = &local_330;
    binlog::SessionWriter::addEvent<binlog::address,void*&>
              (this_00,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               lVar9 + local_398._8_8_,(address *)local_398,&in_R8->_M_head_impl);
    out = extraout_RDX_04;
  }
  local_338.value = 0xf777123;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar7 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
    in_R8 = p_Var13;
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      in_R8 = p_Var13;
    }
    __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    out = extraout_RDX_09;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar7 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
        in_R8 = p_Var15;
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
          in_R8 = p_Var15;
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_318._0_8_ = 0;
      local_318._8_2_ = info;
      local_308._M_p = (pointer)&local_2f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"main","");
      local_2e8._M_p = (pointer)&local_2d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"main","");
      local_2c8._M_p = (pointer)&local_2b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,"");
      local_2a8 = 0x32;
      local_2a0._M_p = (pointer)&local_290;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a0,"Const pointer value: {} {}","");
      builtin_strncpy(local_38,"#qw\x0f",5);
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      binlog::detail::concatenated_tags<char_const(&)[27],binlog::address,void_const*&>
                ((cx_string<50UL> *)local_398,(detail *)"Const pointer value: {} {}",
                 (char (*) [27])local_38,&local_338,&in_R8->_M_head_impl);
      local_280._M_p = (pointer)&local_270;
      sVar6 = strlen(local_398);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_280,local_398,local_398 + sVar6);
      iVar5 = pthread_mutex_lock(ppVar1);
      if (iVar5 != 0) goto LAB_00103560;
      local_318._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_318,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_p != &local_270) {
        operator_delete(local_280._M_p,local_270._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_p != &local_2b8) {
        operator_delete(local_2c8._M_p,local_2b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_p != &local_2d8) {
        operator_delete(local_2e8._M_p,local_2d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_p != &local_2f8) {
        operator_delete(local_308._M_p,local_2f8._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar7 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar7,0x100000,0,(string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    local_398._0_8_ = (int *)0x0;
    local_398._8_8_ = 0;
    clock_gettime(0,(timespec *)local_398);
    lVar9 = local_398._0_8_ * 1000000000;
    local_398._0_8_ = (int *)0xf777123;
    binlog::SessionWriter::addEvent<binlog::address,void_const*&>
              (this_00,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               lVar9 + local_398._8_8_,(address *)local_398,(void **)&local_338);
    out = extraout_RDX_05;
  }
  binlog::consume<std::ostream>((ConsumeResult *)local_398,(binlog *)&std::cout,out);
  if (local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_358._M_head_impl != (int *)0x0) {
    operator_delete(local_358._M_head_impl,4);
  }
  return 0;
}

Assistant:

int main()
{
  // Standard pointers

  //[stdptr
  int* ptr = nullptr;
  std::unique_ptr<int> uptr(std::make_unique<int>(1));
  std::shared_ptr<int> sptr(std::make_shared<int>(2));
  BINLOG_INFO("Pointers: {} {} {}", ptr, uptr, sptr);
  // Outputs: Pointers: {null} 1 2
  //]

  int value = 3;
  ptr = &value;
  uptr.reset();
  sptr.reset();
  BINLOG_INFO("Pointers: {} {} {}", ptr, uptr, sptr);
  // Outputs: Pointers: 3 {null} {null}

  // weak_ptr is not loggable by design, must be .lock()-ed first
  static_assert(
    !mserialize::detail::is_serializable<std::weak_ptr<int>>::value,
    "std::weak_ptr is not loggable"
  );

  // Addresses (raw pointer value)

  std::uintptr_t address = 0xf777123;

  int* any_pointer = nullptr;
  void* void_pointer = nullptr;
  std::memcpy(&any_pointer, &address, sizeof(any_pointer));
  std::memcpy(&void_pointer, &address, sizeof(void_pointer));

  //[address
  BINLOG_INFO("Raw pointer value: {} {}", binlog::address(any_pointer), void_pointer);
  // Outputs: Raw pointer value: 0xF777123 0xF777123
  //]

  const int* const_any_pointer = nullptr;
  const void* const_void_pointer = nullptr;
  std::memcpy(&const_any_pointer, &address, sizeof(const_any_pointer));
  std::memcpy(&const_void_pointer, &address, sizeof(const_void_pointer));

  BINLOG_INFO("Const pointer value: {} {}", binlog::address(const_any_pointer), const_void_pointer);
  // Outputs: Const pointer value: 0xF777123 0xF777123

  binlog::consume(std::cout);
  return 0;
}